

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-header.h
# Opt level: O2

void __thiscall mp::NLInfo::NLInfo(NLInfo *this)

{
  long lVar1;
  
  (this->super_NLInfo_C).format = 1;
  (this->super_NLInfo_C).num_ampl_options = 3;
  (this->super_NLInfo_C).prob_name = "nl_instance";
  (this->super_NLInfo_C).ampl_vbtol = 0.0;
  (this->super_NLInfo_C).arith_kind = 1;
  (this->super_NLInfo_C).flags = 1;
  for (lVar1 = 8; lVar1 != 0x50; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)(this->super_NLInfo_C).ampl_options + lVar1 + -8) = 0;
  }
  (this->super_NLInfo_C).ampl_options[0] = 1;
  (this->super_NLInfo_C).ampl_options[1] = 1;
  (this->super_NLInfo_C).ampl_options[2] = 0;
  return;
}

Assistant:

NLInfo() {
    format = BINARY;
    prob_name = "nl_instance";
    num_ampl_options = 3;
    ampl_vbtol = 0.0;
    arith_kind = NL_ARITH_IEEE_LITTLE_ENDIAN;
    flags = WANT_OUTPUT_SUFFIXES;
    std::fill(ampl_options, ampl_options + MAX_AMPL_OPTIONS, 0);
    std::array<long, 3> opt_default {1, 1, 0};
    std::copy(opt_default.begin(), opt_default.end(), ampl_options);
  }